

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O3

int TIFFReadCustomDirectory(TIFF *tif,toff_t diroff,TIFFFieldArray *infoarray)

{
  ushort uVar1;
  short sVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  TIFFReadDirEntryErr err;
  TIFFField *pTVar6;
  ulong uVar7;
  TIFFDirEntry *pTVar8;
  char *pcVar9;
  uint uVar10;
  TIFFField *fip;
  double dVar11;
  UInt64Aligned_t m;
  TIFFDirEntry *dir;
  uint32_t local_4c;
  undefined8 local_48;
  uint32_t local_3c;
  TIFFDirEntry *local_38;
  
  (*tif->tif_cleanup)(tif);
  _TIFFSetupFields(tif,infoarray);
  uVar10 = 0;
  uVar3 = TIFFFetchDirectory(tif,diroff,&local_38,(uint64_t *)0x0);
  if (uVar3 == 0) {
    iVar5 = 0;
    TIFFErrorExtR(tif,"TIFFReadCustomDirectory","Failed to read custom directory at offset %lu",
                  diroff);
  }
  else {
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir,0,0x158);
    pTVar8 = local_38;
    uVar4 = uVar3;
    do {
      if (pTVar8->tdir_tag < uVar10) {
        TIFFWarningExtR(tif,"TIFFReadDirectoryCheckOrder",
                        "Invalid TIFF directory; tags are not sorted in ascending order");
        break;
      }
      uVar10 = pTVar8->tdir_tag + 1;
      pTVar8 = pTVar8 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
    uVar4 = 0;
    pTVar8 = local_38;
    do {
      uVar1 = pTVar8->tdir_tag;
      TIFFReadDirectoryFindFieldInfo(tif,uVar1,&local_4c);
      uVar7 = (ulong)local_4c;
      if (local_4c == 0xffffffff) {
        TIFFWarningExtR(tif,"TIFFReadCustomDirectory","Unknown field with tag %u (0x%x) encountered"
                        ,(ulong)uVar1,(ulong)uVar1);
        pTVar6 = _TIFFCreateAnonField(tif,(uint)pTVar8->tdir_tag,(uint)pTVar8->tdir_type);
        iVar5 = _TIFFMergeFields(tif,pTVar6,1);
        uVar1 = pTVar8->tdir_tag;
        if (iVar5 == 0) {
          TIFFWarningExtR(tif,"TIFFReadCustomDirectory",
                          "Registering anonymous field with tag %u (0x%x) failed",(ulong)uVar1,
                          (ulong)uVar1);
          pTVar8->tdir_ignore = '\x01';
          uVar7 = 0xffffffff;
        }
        else {
          TIFFReadDirectoryFindFieldInfo(tif,uVar1,&local_4c);
          uVar7 = (ulong)local_4c;
          if (local_4c == 0xffffffff) {
            __assert_fail("fii != FAILED_FII",
                          "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_dirread.c"
                          ,0x1424,
                          "int TIFFReadCustomDirectory(TIFF *, toff_t, const TIFFFieldArray *)");
          }
        }
      }
      if (pTVar8->tdir_ignore == '\0') {
        pTVar6 = tif->tif_fields[uVar7];
        if (pTVar6->field_bit != 0) {
          do {
            fip = pTVar6;
            local_4c = (uint32_t)uVar7;
            if ((fip->field_type == TIFF_NOTYPE) ||
               (uVar1 = pTVar8->tdir_type, fip->field_type == (uint)uVar1)) {
              if (local_4c == 0xffff) {
                uVar1 = pTVar8->tdir_type;
                goto LAB_00292fea;
              }
              sVar2 = fip->field_readcount;
              if ((sVar2 != -3) && (sVar2 != -1)) {
                if (sVar2 == -2) {
                  uVar10 = (uint)(tif->tif_dir).td_samplesperpixel;
                }
                else {
                  uVar10 = (uint)sVar2;
                }
                uVar7 = (ulong)uVar10;
                if (pTVar8->tdir_count < uVar7) {
                  pTVar6 = TIFFFieldWithTag(tif,(uint)pTVar8->tdir_tag);
                  pcVar9 = "unknown tagname";
                  if (pTVar6 != (TIFFField *)0x0) {
                    pcVar9 = pTVar6->field_name;
                  }
                  TIFFWarningExtR(tif,tif->tif_name,
                                  "incorrect count for field \"%s\" (%lu, expecting %u); tag ignored"
                                  ,pcVar9,pTVar8->tdir_count,uVar7);
                  goto LAB_00293006;
                }
                if (uVar7 < pTVar8->tdir_count) {
                  pTVar6 = TIFFFieldWithTag(tif,(uint)pTVar8->tdir_tag);
                  pcVar9 = "unknown tagname";
                  if (pTVar6 != (TIFFField *)0x0) {
                    pcVar9 = pTVar6->field_name;
                  }
                  TIFFWarningExtR(tif,tif->tif_name,
                                  "incorrect count for field \"%s\" (%lu, expecting %u); tag trimmed"
                                  ,pcVar9,pTVar8->tdir_count,uVar7);
                  pTVar8->tdir_count = uVar7;
                  if (pTVar8->tdir_ignore != '\0') goto LAB_0029300b;
                }
              }
              if ((pTVar8->tdir_tag == 0x9206) && (iVar5 = TIFFFieldIsAnonymous(fip), iVar5 == 0)) {
                local_48 = 0;
                err = TIFFReadDirEntryErrCount;
                if ((pTVar8->tdir_count == 1) &&
                   (err = TIFFReadDirEntryErrType, pTVar8->tdir_type == 5)) {
                  uVar10 = tif->tif_flags;
                  if ((uVar10 >> 0x13 & 1) == 0) {
                    local_3c = (pTVar8->tdir_offset).toff_long;
                    if ((char)uVar10 < '\0') {
                      TIFFSwabLong(&local_3c);
                    }
                    err = TIFFReadDirEntryData(tif,(ulong)local_3c,8,&local_48);
                    if (err != TIFFReadDirEntryErrOk) goto LAB_00293162;
                    uVar10 = tif->tif_flags;
                  }
                  else {
                    local_48 = (pTVar8->tdir_offset).toff_long8;
                  }
                  if ((char)uVar10 < '\0') {
                    TIFFSwabArrayOfLong((uint32_t *)&local_48,2);
                  }
                  if ((uint32_t)local_48 == 0) {
                    dVar11 = 0.0;
                  }
                  else {
                    dVar11 = -1.0;
                    if (local_48._4_4_ != 0 && (uint32_t)local_48 != 0xffffffff) {
                      dVar11 = (double)(local_48 & 0xffffffff) / (double)local_48._4_4_;
                    }
                  }
                  TIFFSetField(tif,(uint)pTVar8->tdir_tag,dVar11);
                }
                else {
LAB_00293162:
                  TIFFReadDirEntryOutputErr(tif,err,"TIFFFetchSubjectDistance","SubjectDistance",1);
                }
              }
              else {
                TIFFFetchNormalTag(tif,pTVar8,1);
              }
              goto LAB_0029300b;
            }
            uVar7 = (ulong)(local_4c + 1);
          } while ((tif->tif_nfields != uVar7) &&
                  (pTVar6 = tif->tif_fields[uVar7], pTVar6->field_tag == (uint)pTVar8->tdir_tag));
          local_4c = 0xffff;
LAB_00292fea:
          TIFFWarningExtR(tif,"TIFFReadCustomDirectory","Wrong data type %u for \"%s\"; tag ignored"
                          ,(ulong)uVar1,fip->field_name);
        }
LAB_00293006:
        pTVar8->tdir_ignore = '\x01';
      }
LAB_0029300b:
      uVar4 = uVar4 + 1;
      pTVar8 = pTVar8 + 1;
    } while (uVar4 != uVar3);
    tif->tif_setdirectory_force_absolute = 1;
    iVar5 = 1;
    if (local_38 != (TIFFDirEntry *)0x0) {
      _TIFFfreeExt(tif,local_38);
    }
  }
  return iVar5;
}

Assistant:

int TIFFReadCustomDirectory(TIFF *tif, toff_t diroff,
                            const TIFFFieldArray *infoarray)
{
    static const char module[] = "TIFFReadCustomDirectory";
    TIFFDirEntry *dir;
    uint16_t dircount;
    TIFFDirEntry *dp;
    uint16_t di;
    const TIFFField *fip;
    uint32_t fii;
    (*tif->tif_cleanup)(tif); /* cleanup any previous compression state */
    _TIFFSetupFields(tif, infoarray);
    dircount = TIFFFetchDirectory(tif, diroff, &dir, NULL);
    if (!dircount)
    {
        TIFFErrorExtR(tif, module,
                      "Failed to read custom directory at offset %" PRIu64,
                      diroff);
        return 0;
    }
    TIFFFreeDirectory(tif);
    _TIFFmemset(&tif->tif_dir, 0, sizeof(TIFFDirectory));
    TIFFReadDirectoryCheckOrder(tif, dir, dircount);
    for (di = 0, dp = dir; di < dircount; di++, dp++)
    {
        TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
        if (fii == FAILED_FII)
        {
            TIFFWarningExtR(tif, module,
                            "Unknown field with tag %" PRIu16 " (0x%" PRIx16
                            ") encountered",
                            dp->tdir_tag, dp->tdir_tag);
            if (!_TIFFMergeFields(
                    tif,
                    _TIFFCreateAnonField(tif, dp->tdir_tag,
                                         (TIFFDataType)dp->tdir_type),
                    1))
            {
                TIFFWarningExtR(tif, module,
                                "Registering anonymous field with tag %" PRIu16
                                " (0x%" PRIx16 ") failed",
                                dp->tdir_tag, dp->tdir_tag);
                dp->tdir_ignore = TRUE;
            }
            else
            {
                TIFFReadDirectoryFindFieldInfo(tif, dp->tdir_tag, &fii);
                assert(fii != FAILED_FII);
            }
        }
        if (!dp->tdir_ignore)
        {
            fip = tif->tif_fields[fii];
            if (fip->field_bit == FIELD_IGNORE)
                dp->tdir_ignore = TRUE;
            else
            {
                /* check data type */
                while ((fip->field_type != TIFF_ANY) &&
                       (fip->field_type != dp->tdir_type))
                {
                    fii++;
                    if ((fii == tif->tif_nfields) ||
                        (tif->tif_fields[fii]->field_tag !=
                         (uint32_t)dp->tdir_tag))
                    {
                        fii = 0xFFFF;
                        break;
                    }
                    fip = tif->tif_fields[fii];
                }
                if (fii == 0xFFFF)
                {
                    TIFFWarningExtR(tif, module,
                                    "Wrong data type %" PRIu16
                                    " for \"%s\"; tag ignored",
                                    dp->tdir_type, fip->field_name);
                    dp->tdir_ignore = TRUE;
                }
                else
                {
                    /* check count if known in advance */
                    if ((fip->field_readcount != TIFF_VARIABLE) &&
                        (fip->field_readcount != TIFF_VARIABLE2))
                    {
                        uint32_t expected;
                        if (fip->field_readcount == TIFF_SPP)
                            expected =
                                (uint32_t)tif->tif_dir.td_samplesperpixel;
                        else
                            expected = (uint32_t)fip->field_readcount;
                        if (!CheckDirCount(tif, dp, expected))
                            dp->tdir_ignore = TRUE;
                    }
                }
            }
            if (!dp->tdir_ignore)
            {
                switch (dp->tdir_tag)
                {
                    case EXIFTAG_SUBJECTDISTANCE:
                        if (!TIFFFieldIsAnonymous(fip))
                        {
                            /* should only be called on a Exif directory */
                            /* when exifFields[] is active */
                            (void)TIFFFetchSubjectDistance(tif, dp);
                        }
                        else
                        {
                            (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        }
                        break;
                    default:
                        (void)TIFFFetchNormalTag(tif, dp, TRUE);
                        break;
                }
            } /*-- if (!dp->tdir_ignore) */
        }
    }
    /* To be able to return from SubIFD or custom-IFD to main-IFD */
    tif->tif_setdirectory_force_absolute = TRUE;
    if (dir)
        _TIFFfreeExt(tif, dir);
    return 1;
}